

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

int __thiscall pstore::database::open(database *this,char *__file,int __oflag,...)

{
  element_type *this_00;
  __type_conflict _Var1;
  uint __oflag_00;
  int __oflag_01;
  char *__new;
  int __fd;
  string *path;
  shared_ptr<pstore::file::file_handle> temporary_file;
  deleter temp_file_deleter;
  string local_40;
  
  std::make_shared<pstore::file::file_handle,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  __oflag_00 = (uint)(__oflag - 1U < 2);
  pstore::file::file_handle::open((file_handle *)this->_vptr_database,(char *)0x1,__oflag_00,0);
  if (*(int *)(this->_vptr_database + 5) != -1) {
LAB_001cb479:
    return (int)this;
  }
  if (__oflag != 1) {
    raise<std::errc,std::__cxx11::string>
              (no_such_file_or_directory,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file);
  }
  std::make_shared<pstore::file::file_handle>();
  this_00 = temporary_file.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  pstore::path::posix::dir_name((string *)&temp_file_deleter,(string *)__file);
  pstore::file::file_handle::open(this_00,(char *)&temp_file_deleter,__oflag_01);
  std::__cxx11::string::~string((string *)&temp_file_deleter);
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             &(temporary_file.
               super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              path_);
  path = &local_40;
  pstore::file::posix::deleter::deleter(&temp_file_deleter,path);
  __fd = (int)path;
  std::__cxx11::string::~string((string *)&local_40);
  build_new_store(&(temporary_file.
                    super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_file_base);
  pstore::file::file_handle::close
            (temporary_file.
             super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd);
  pstore::file::file_handle::rename
            (temporary_file.
             super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__file
             ,__new);
  temp_file_deleter.super_deleter_base.released_ = true;
  pstore::file::posix::deleter::~deleter(&temp_file_deleter);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&temporary_file.
              super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  pstore::file::file_handle::open((file_handle *)this->_vptr_database,(char *)0x1,__oflag_00);
  if (*(int *)(this->_vptr_database + 5) != -1) {
    std::__cxx11::string::string((string *)&temp_file_deleter,(string *)(this->_vptr_database + 1));
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &temp_file_deleter,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __file);
    if (_Var1) {
      std::__cxx11::string::~string((string *)&temp_file_deleter);
      goto LAB_001cb479;
    }
  }
  assert_failed("file->is_open () && file->path () == path",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0x12e);
}

Assistant:

auto database::open (std::string const & path, access_mode const am)
        -> std::shared_ptr<file::file_handle> {

        using present_mode = file::file_handle::present_mode;
        auto const create_mode = file::file_handle::create_mode::open_existing;
        auto const write_mode =
            (am == access_mode::writable || am == access_mode::writeable_no_create)
                ? file::file_handle::writable_mode::read_write
                : file::file_handle::writable_mode::read_only;

        auto file = std::make_shared<file::file_handle> (path);
        file->open (create_mode, write_mode, present_mode::allow_not_found);
        if (file->is_open ()) {
            return file;
        }

        if (am != access_mode::writable) {
            raise (std::errc::no_such_file_or_directory, path);
        }

        // We didn't find the file so will have to create a new one.
        //
        // To ensure that this operation is as close to atomic as the host OS allows, we create
        // a temporary file in the same directory but with a random name. (This approach was
        // chosen because this directory most likely has the same permissions and is on the same
        // physical volume as the final file). We then populate that file with the basic data
        // structures and rename it to the final destination.
        {
            auto const temporary_file = std::make_shared<file::file_handle> ();
            temporary_file->open (file::file_handle::unique{}, path::dir_name (path));
            file::deleter temp_file_deleter (temporary_file->path ());
            // Fill the file with its initial contents.
            database::build_new_store (*temporary_file);
            temporary_file->close ();
            temporary_file->rename (path);
            // The temporary file will no longer be found anyway (we just renamed it).
            temp_file_deleter.release ();
        }
        file->open (create_mode, write_mode, file::file_handle::present_mode::must_exist);
        PSTORE_ASSERT (file->is_open () && file->path () == path);
        return file;
    }